

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseTracking::SectionTracker::~SectionTracker(SectionTracker *this)

{
  ~SectionTracker(this);
  operator_delete(this);
  return;
}

Assistant:

TrackerBase::~TrackerBase() {}